

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Watcher.cpp
# Opt level: O0

void __thiscall
efsw::Watcher::Watcher
          (Watcher *this,WatchID id,string *directory,FileWatchListener *listener,bool recursive)

{
  bool recursive_local;
  FileWatchListener *listener_local;
  string *directory_local;
  WatchID id_local;
  Watcher *this_local;
  
  this->_vptr_Watcher = (_func_int **)&PTR__Watcher_0013fc88;
  this->ID = id;
  std::__cxx11::string::string((string *)&this->Directory,(string *)directory);
  this->Listener = listener;
  this->Recursive = recursive;
  std::__cxx11::string::string((string *)&this->OldFileName);
  return;
}

Assistant:

Watcher::Watcher( WatchID id, std::string directory, FileWatchListener* listener, bool recursive ) :
	ID( id ), Directory( directory ), Listener( listener ), Recursive( recursive ) {}